

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio.hpp
# Opt level: O1

void __thiscall ELFIO::elfio::create(elfio *this,uchar file_class,uchar encoding)

{
  pointer puVar1;
  pointer puVar2;
  section *psVar3;
  pointer puVar4;
  pointer puVar5;
  segment *psVar6;
  elf_header *peVar7;
  Sections SVar8;
  elfio *in_RAX;
  pointer *__ptr_2;
  pointer *__ptr;
  pointer puVar9;
  pointer puVar10;
  Sections local_38;
  
  puVar1 = (this->sections_).
           super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->sections_).
           super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar9 = puVar1;
  local_38.parent = in_RAX;
  if (puVar2 != puVar1) {
    do {
      psVar3 = (puVar9->_M_t).
               super___uniq_ptr_impl<ELFIO::section,_std::default_delete<ELFIO::section>_>._M_t.
               super__Tuple_impl<0UL,_ELFIO::section_*,_std::default_delete<ELFIO::section>_>.
               super__Head_base<0UL,_ELFIO::section_*,_false>._M_head_impl;
      if (psVar3 != (section *)0x0) {
        (*psVar3->_vptr_section[1])();
      }
      (puVar9->_M_t).super___uniq_ptr_impl<ELFIO::section,_std::default_delete<ELFIO::section>_>.
      _M_t.super__Tuple_impl<0UL,_ELFIO::section_*,_std::default_delete<ELFIO::section>_>.
      super__Head_base<0UL,_ELFIO::section_*,_false>._M_head_impl = (section *)0x0;
      puVar9 = puVar9 + 1;
    } while (puVar9 != puVar2);
    (this->sections_).
    super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar1;
  }
  puVar4 = (this->segments_).
           super__Vector_base<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>,_std::allocator<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar5 = (this->segments_).
           super__Vector_base<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>,_std::allocator<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar10 = puVar4;
  if (puVar5 != puVar4) {
    do {
      psVar6 = (puVar10->_M_t).
               super___uniq_ptr_impl<ELFIO::segment,_std::default_delete<ELFIO::segment>_>._M_t.
               super__Tuple_impl<0UL,_ELFIO::segment_*,_std::default_delete<ELFIO::segment>_>.
               super__Head_base<0UL,_ELFIO::segment_*,_false>._M_head_impl;
      if (psVar6 != (segment *)0x0) {
        (*psVar6->_vptr_segment[1])();
      }
      (puVar10->_M_t).super___uniq_ptr_impl<ELFIO::segment,_std::default_delete<ELFIO::segment>_>.
      _M_t.super__Tuple_impl<0UL,_ELFIO::segment_*,_std::default_delete<ELFIO::segment>_>.
      super__Head_base<0UL,_ELFIO::segment_*,_false>._M_head_impl = (segment *)0x0;
      puVar10 = puVar10 + 1;
    } while (puVar10 != puVar5);
    (this->segments_).
    super__Vector_base<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>,_std::allocator<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar4;
  }
  (this->convertor).need_conversion = encoding != '\x01';
  create_header((elfio *)&stack0xffffffffffffffc8,(uchar)this,file_class);
  SVar8.parent = local_38.parent;
  local_38.parent = (elfio *)0x0;
  peVar7 = (this->header)._M_t.
           super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>._M_t.
           super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>.
           super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl;
  (this->header)._M_t.
  super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>._M_t.
  super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>.
  super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl = (elf_header *)SVar8.parent;
  if (peVar7 != (elf_header *)0x0) {
    (*peVar7->_vptr_elf_header[1])();
  }
  if (local_38.parent != (elfio *)0x0) {
    (*(code *)((((local_38.parent)->sections).parent)->segments).parent)();
  }
  create_mandatory_sections(this);
  return;
}

Assistant:

void create( unsigned char file_class, unsigned char encoding )
    {
        sections_.clear();
        segments_.clear();
        convertor.setup( encoding );
        header = create_header( file_class, encoding );
        create_mandatory_sections();
    }